

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::Solve
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this)

{
  ostream *poVar1;
  BGIP_BnB_Node *this_00;
  ulong uVar2;
  reference pvVar3;
  uint uVar4;
  BGIP_BnB_NodePtr root;
  string local_48;
  double local_28;
  
  this->_m_solved = true;
  (*(code *)**(undefined8 **)
              &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
               super_BGIP_IncrementalSolverInterface)();
  if (0 < this->_m_verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound::Solve() called.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  ComputeCompleteInformationValues(this);
  ReOrderJointTypes(this,&this->_m_jtIndexMapping);
  if (0 < this->_m_verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Resulting order of joint types: ");
    PrintTools::SoftPrintVector<unsigned_int>(&local_48,&this->_m_jtIndexMapping);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  root.px = (element_type *)0x0;
  root.pn.pi_ = (sp_counted_base *)0x0;
  this_00 = (BGIP_BnB_Node *)operator_new(0x40);
  uVar2 = (**(code **)(*(long *)(this->_m_bgip).px + 0x18))();
  BGIP_BnB_Node::BGIP_BnB_Node(this_00,uVar2);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>
            ((shared_ptr<BGIP_BnB_Node> *)&local_48,this_00);
  boost::shared_ptr<BGIP_BnB_Node>::operator=(&root,(shared_ptr<BGIP_BnB_Node> *)&local_48);
  boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_string_length);
  uVar4 = 0;
  while( true ) {
    uVar2 = BayesianGameBase::GetNrJointTypes();
    if (uVar2 == uVar4) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       (&this->_m_completeInformationValues,(ulong)uVar4);
    BGIP_BnB_Node::UpdateH(*pvVar3);
    uVar4 = uVar4 + 1;
  }
  std::
  priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
  ::push(this->_m_openQueue,&root);
  if (3 < this->_m_verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
    BGIP_BnB_Node::SoftPrint_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  local_28 = ReSolve(this);
  boost::detail::shared_count::~shared_count(&root.pn);
  return local_28;
}

Assistant:

double Solve()
    {
        _m_solved=true;
        this->InitDeadline();
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound::Solve() called."<<std::endl;
        // Compute upper bound heuristic values
        ComputeCompleteInformationValues();
        
        // Reorder the joint types
        ReOrderJointTypes(_m_jtIndexMapping); 

        if(_m_verbosity>=1)
            std::cout
                << "BGIP_SolverBranchAndBound Resulting order of joint types: "
                << SoftPrintVector(_m_jtIndexMapping) << std::endl;

        // Initialize root node
        BGIP_BnB_NodePtr root;
        // If we want to update the joint type index mapping during the
        // search, we have to maintain it for each node. Otherwise we can
        // just use the copy in this class.
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_reComputeJTIndexMapping)
            root = new BGIP_BnB_Node(_m_bgip, _m_maxDepth,
                                     _m_jtIndexMapping);
        else
#endif
            root = BGIP_BnB_NodePtr(new BGIP_BnB_Node(_m_bgip->GetNrAgents()));
        // G is initialized to 0,
        // H is also initialized to 0, so we now *add* the contributions for each joint type
        for(Index jt_bgI=0;jt_bgI!=_m_bgip->GetNrJointTypes();++jt_bgI)
            root->UpdateH(_m_completeInformationValues.at(jt_bgI));

        // push the root node on the queue of open nodes
        _m_openQueue->push(root);

        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound "
                      << root->SoftPrint() << std::endl;

        return(ReSolve());
    }